

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> __thiscall Parser::parseStmt(Parser *this)

{
  TokenType TVar1;
  _Alloc_hider _Var2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  long *plVar6;
  _func_int *p_Var7;
  _func_int **pp_Var8;
  undefined8 *puVar9;
  pointer pcVar10;
  undefined **ppuVar11;
  Parser *in_RSI;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> expr;
  undefined1 local_d0 [8];
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_a8 [8];
  pointer puStack_a0;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> local_58;
  _Head_base<0UL,_AST::Stmt_*,_false> local_50;
  vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
  local_48;
  
  while (TVar1 = (in_RSI->m_currToken).type, TVar1 == EOL) {
    eatToken(in_RSI,EOL);
  }
  switch(TVar1) {
  case Def:
    local_50._M_head_impl = (Stmt *)this;
    eatToken(in_RSI,Def);
    local_d0 = *(undefined1 (*) [8])&in_RSI->m_currToken;
    local_c8 = local_c0._M_local_buf + 8;
    pcVar10 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar10,pcVar10 + (in_RSI->m_currToken).literal._M_string_length)
    ;
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,LeftParen);
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((in_RSI->m_currToken).type != RightParen) {
      do {
        local_a8 = *(undefined1 (*) [8])&in_RSI->m_currToken;
        pcVar10 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
        puStack_a0 = (pointer)(local_98 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&puStack_a0,pcVar10,
                   pcVar10 + (in_RSI->m_currToken).literal._M_string_length);
        eatToken(in_RSI,Identifier);
        if ((in_RSI->m_currToken).type != RightParen) {
          eatToken(in_RSI,Comma);
        }
        plVar6 = (long *)operator_new(0x28);
        local_78._M_p = (pointer)&local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,puStack_a0,
                   (pointer)((long)&(puStack_a0->_M_t).
                                    super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>
                                    .super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl +
                            local_98._0_8_));
        *plVar6 = (long)&PTR__Identifier_001827b0;
        plVar6[1] = (long)(plVar6 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar6 + 1),local_78._M_p,local_70._M_p + local_78._M_p);
        local_58._M_t.super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>.
        _M_t.super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
        super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl =
             (__uniq_ptr_data<AST::Identifier,_std::default_delete<AST::Identifier>,_true,_true>)
             (__uniq_ptr_data<AST::Identifier,_std::default_delete<AST::Identifier>,_true,_true>)
             plVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        std::
        vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>
        ::emplace_back<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>
                  ((vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>
                    *)&local_48,&local_58);
        if (local_58._M_t.
            super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
            super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
            super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>)0x0) {
          (**(code **)(*(long *)local_58._M_t.
                                super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>
                                .super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl + 8))
                    ();
        }
        if (puStack_a0 != (pointer)(local_98 + 8)) {
          operator_delete(puStack_a0,local_98._8_8_ + 1);
        }
      } while ((in_RSI->m_currToken).type != RightParen);
    }
    eatToken(in_RSI,RightParen);
    parseBlockStmt((Parser *)&local_78);
    p_Var7 = (_func_int *)operator_new(0x28);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_c8,local_c8 + local_c0._M_allocated_capacity);
    this = (Parser *)local_50._M_head_impl;
    *(undefined ***)p_Var7 = &PTR__Identifier_001827b0;
    *(_func_int **)(p_Var7 + 8) = p_Var7 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var7 + 8),local_a8,(pointer)((long)local_a8 + (long)&puStack_a0->_M_t));
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._0_8_ + 1));
    }
    pp_Var8 = (_func_int **)operator_new(0x30);
    puVar5 = local_48.
             super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar4 = local_48.
             super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar3 = local_48.
             super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_p = local_78._M_p;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78._M_p = (pointer)0x0;
    *pp_Var8 = (_func_int *)&PTR__FnDecl_00182908;
    pp_Var8[1] = p_Var7;
    pp_Var8[2] = (_func_int *)puVar3;
    pp_Var8[3] = (_func_int *)puVar4;
    pp_Var8[4] = (_func_int *)puVar5;
    local_98._0_8_ = (pointer)0x0;
    local_a8 = (undefined1  [8])0x0;
    puStack_a0 = (pointer)0x0;
    pp_Var8[5] = (_func_int *)_Var2._M_p;
    std::
    vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ::~vector((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
               *)local_a8);
    ((Stmt *)this)->_vptr_Stmt = pp_Var8;
    std::
    vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ::~vector(&local_48);
    if (local_c8 == local_c0._M_local_buf + 8) {
      return (unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>)this;
    }
    goto LAB_00132ecb;
  case Let:
    eatToken(in_RSI,Let);
    local_d0 = *(undefined1 (*) [8])&in_RSI->m_currToken;
    local_c8 = local_c0._M_local_buf + 8;
    pcVar10 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar10,pcVar10 + (in_RSI->m_currToken).literal._M_string_length)
    ;
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,Equal);
    parseOrExpr((Parser *)&local_78);
    puVar9 = (undefined8 *)operator_new(0x28);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_c8,local_c8 + local_c0._M_allocated_capacity);
    *puVar9 = &PTR__Identifier_001827b0;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_a8,(pointer)((long)local_a8 + (long)&puStack_a0->_M_t));
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._0_8_ + 1));
    }
    pcVar10 = (pointer)operator_new(0x18);
    _Var2._M_p = local_78._M_p;
    local_78._M_p = (pointer)0x0;
    *(undefined ***)pcVar10 = &PTR__LetStmt_00182808;
    *(undefined8 **)(pcVar10 + 8) = puVar9;
    *(pointer *)(pcVar10 + 0x10) = _Var2._M_p;
    goto LAB_00132eb9;
  default:
    parseOrExpr((Parser *)local_d0);
    if ((in_RSI->m_currToken).type == Equal) {
      eatToken(in_RSI,Equal);
      parseOrExpr((Parser *)local_a8);
      pcVar10 = (pointer)operator_new(0x18);
      *(undefined ***)pcVar10 = &PTR__AssignStmt_00182988;
      *(undefined1 (*) [8])(pcVar10 + 8) = local_d0;
      *(undefined1 (*) [8])(pcVar10 + 0x10) = local_a8;
    }
    else {
      pcVar10 = (pointer)operator_new(0x10);
      *(undefined ***)pcVar10 = &PTR__ExprStmt_001829c8;
      *(undefined1 (*) [8])(pcVar10 + 8) = local_d0;
    }
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar10;
    break;
  case If:
  case Elif:
    eatToken(in_RSI,TVar1);
    parseOrExpr((Parser *)local_d0);
    parseBlockStmt((Parser *)local_a8);
    TVar1 = (in_RSI->m_currToken).type;
    if (TVar1 == Else) {
      eatToken(in_RSI,Else);
      parseBlockStmt((Parser *)&local_78);
      pcVar10 = (pointer)operator_new(0x20);
LAB_00132fb3:
      *(undefined ***)pcVar10 = &PTR__IfStmt_001826a0;
      *(undefined1 (*) [8])(pcVar10 + 8) = local_d0;
      *(undefined1 (*) [8])(pcVar10 + 0x10) = local_a8;
      *(pointer *)(pcVar10 + 0x18) = local_78._M_p;
    }
    else {
      if (TVar1 == Elif) {
        parseStmt((Parser *)&local_78);
        pcVar10 = (pointer)operator_new(0x20);
        goto LAB_00132fb3;
      }
      pcVar10 = (pointer)operator_new(0x20);
      *(undefined ***)pcVar10 = &PTR__IfStmt_001826a0;
      *(undefined1 (*) [8])(pcVar10 + 8) = local_d0;
      *(undefined1 (*) [8])(pcVar10 + 0x10) = local_a8;
      pcVar10[0x18] = '\0';
      pcVar10[0x19] = '\0';
      pcVar10[0x1a] = '\0';
      pcVar10[0x1b] = '\0';
      pcVar10[0x1c] = '\0';
      pcVar10[0x1d] = '\0';
      pcVar10[0x1e] = '\0';
      pcVar10[0x1f] = '\0';
    }
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar10;
    break;
  case While:
    eatToken(in_RSI,While);
    parseOrExpr((Parser *)local_d0);
    parseBlockStmt((Parser *)local_a8);
    pcVar10 = (pointer)operator_new(0x18);
    *(undefined ***)pcVar10 = &PTR__WhileStmt_001826f0;
    *(undefined1 (*) [8])(pcVar10 + 8) = local_d0;
    *(undefined1 (*) [8])(pcVar10 + 0x10) = local_a8;
    goto LAB_00132f1d;
  case Return:
    eatToken(in_RSI,Return);
    parseOrExpr((Parser *)local_d0);
    pcVar10 = (pointer)operator_new(0x10);
    ppuVar11 = &PTR__ReturnStmt_00182948;
    goto LAB_00132f16;
  case Next:
    eatToken(in_RSI,Next);
    pcVar10 = (pointer)operator_new(8);
    ppuVar11 = &PTR__Stmt_00182730;
    goto LAB_00132dea;
  case Break:
    eatToken(in_RSI,Break);
    pcVar10 = (pointer)operator_new(8);
    ppuVar11 = &PTR__Stmt_00182770;
LAB_00132dea:
    *(undefined ***)pcVar10 = ppuVar11;
    goto LAB_00132f1d;
  case Print:
    eatToken(in_RSI,Print);
    parseOrExpr((Parser *)local_d0);
    pcVar10 = (pointer)operator_new(0x10);
    ppuVar11 = &PTR__PrintStmt_00182848;
    goto LAB_00132f16;
  case Scan:
    eatToken(in_RSI,Scan);
    local_d0 = *(undefined1 (*) [8])&in_RSI->m_currToken;
    local_c8 = local_c0._M_local_buf + 8;
    pcVar10 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar10,pcVar10 + (in_RSI->m_currToken).literal._M_string_length)
    ;
    eatToken(in_RSI,Identifier);
    puVar9 = (undefined8 *)operator_new(0x28);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_c8,local_c8 + local_c0._M_allocated_capacity);
    *puVar9 = &PTR__Identifier_001827b0;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_a8,(pointer)((long)local_a8 + (long)&puStack_a0->_M_t));
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._0_8_ + 1));
    }
    pcVar10 = (pointer)operator_new(0x10);
    *(undefined ***)pcVar10 = &PTR__ScanStmt_001828c8;
    *(undefined8 **)(pcVar10 + 8) = puVar9;
LAB_00132eb9:
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar10;
    if (local_c8 != local_c0._M_local_buf + 8) {
LAB_00132ecb:
      operator_delete(local_c8,local_c0._8_8_ + 1);
    }
    break;
  case Err:
    eatToken(in_RSI,Err);
    parseOrExpr((Parser *)local_d0);
    pcVar10 = (pointer)operator_new(0x10);
    ppuVar11 = &PTR__ErrStmt_00182888;
LAB_00132f16:
    *(undefined ***)pcVar10 = ppuVar11;
    *(undefined1 (*) [8])(pcVar10 + 8) = local_d0;
LAB_00132f1d:
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar10;
    break;
  case END:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)0x0;
  }
  return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
         (tuple<AST::Stmt_*,_std::default_delete<AST::Stmt>_>)this;
}

Assistant:

std::unique_ptr<AST::Stmt> Parser::parseStmt() {
    if (m_currToken.type == TokenType::END) {
        return nullptr;
    }
    if (m_currToken.type == TokenType::EOL) {
        eatToken(TokenType::EOL);
        return parseStmt();
    }
    if (m_currToken.type == TokenType::If || m_currToken.type == TokenType::Elif) {
        eatToken(m_currToken.type);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        if (m_currToken.type == TokenType::Elif) {
            auto falseBody = parseStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        } else if (m_currToken.type == TokenType::Else) {
            eatToken(TokenType::Else);
            auto falseBody = parseBlockStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        }

        return std::make_unique<AST::IfStmt>(std::move(cond), std::move(body), nullptr);
    }

    if (m_currToken.type == TokenType::While) {
        eatToken(TokenType::While);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        return std::make_unique<AST::WhileStmt>(std::move(cond), std::move(body));
    }

    if (m_currToken.type == TokenType::Next) {
        eatToken(TokenType::Next);
        return std::make_unique<AST::NextStmt>();
    }

    if (m_currToken.type == TokenType::Break) {
        eatToken(TokenType::Break);
        return std::make_unique<AST::BreakStmt>();
    }

    if (m_currToken.type == TokenType::Let) {
        eatToken(TokenType::Let);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::Equal);
        auto val = parseExpr();
        return std::make_unique<AST::LetStmt>(std::make_unique<AST::Identifier>(id.literal), std::move(val));
    }

    if (m_currToken.type == TokenType::Print) {
        eatToken(TokenType::Print);
        auto expr = parseExpr();
        return std::make_unique<AST::PrintStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Err) {
        eatToken(TokenType::Err);
        auto expr = parseExpr();
        return std::make_unique<AST::ErrStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Scan) {
        eatToken(TokenType::Scan);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        return std::make_unique<AST::ScanStmt>(std::make_unique<AST::Identifier>(id.literal));
    }

    if (m_currToken.type == TokenType::Def) {
        eatToken(TokenType::Def);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::LeftParen);
        std::vector<std::unique_ptr<AST::Identifier>> params;
        while (m_currToken.type != TokenType::RightParen) {
            Token param = m_currToken;
            eatToken(TokenType::Identifier);
            if (m_currToken.type != TokenType::RightParen) {
                eatToken(TokenType::Comma);
            }
            params.push_back(std::make_unique<AST::Identifier>(param.literal));
        }
        eatToken(TokenType::RightParen);
        auto body = parseBlockStmt();
        return std::make_unique<AST::FnDecl>(std::make_unique<AST::Identifier>(id.literal),
                                             std::move(params),
                                             std::move(body));
    }

    if (m_currToken.type == TokenType::Return) {
        eatToken(TokenType::Return);
        std::unique_ptr<AST::Expr> expr = parseExpr();
        return std::make_unique<AST::ReturnStmt>(std::move(expr));
    }

    // assignment or expr statement
    std::unique_ptr<AST::Expr> expr = parseExpr();
    if (m_currToken.type == TokenType::Equal) {
        eatToken(TokenType::Equal);
        auto rval = parseExpr();
        // TODO: add checks that lval is valid.
        return std::make_unique<AST::AssignStmt>(std::move(expr), std::move(rval));
    } else {
        return std::make_unique<AST::ExprStmt>(std::move(expr));
    }
}